

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O1

fdb_status
wal_commit(fdb_txn *txn,filemgr *file,wal_commit_mark_func *func,err_log_callback *log_callback)

{
  byte *pbVar1;
  pthread_spinlock_t *__lock;
  avl_node **ppaVar2;
  list_elem *plVar3;
  wal *pwVar4;
  avl_node *node;
  avl_node *paVar5;
  long lVar6;
  avl_node *__ptr;
  list_elem *e;
  fdb_kvs_id_t fVar7;
  list_elem *plVar8;
  uint32_t uVar9;
  fdb_status status;
  list_elem *e_00;
  ulong uVar10;
  wal **ppwVar11;
  long local_78;
  fdb_kvs_id_t kv_id;
  fdb_txn *local_68;
  err_log_callback *local_60;
  list_elem *local_58;
  wal_commit_mark_func *local_50;
  long local_48;
  wal **local_40;
  list_elem *local_38;
  
  e_00 = txn->items->head;
  if (e_00 == (list_elem *)0x0) {
    local_78 = 0;
  }
  else {
    ppwVar11 = &file->wal;
    local_58 = (list_elem *)&file->global_txn;
    local_78 = 0;
    local_68 = txn;
    local_60 = log_callback;
    local_50 = func;
    local_40 = ppwVar11;
    do {
      if (e_00[-3].prev != (list_elem *)txn->txn_id) {
        fdb_assert_die("item->txn_id == txn->txn_id",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                       ,0x4ee,(uint64_t)e_00[-3].prev,txn->txn_id);
      }
      uVar9 = get_checksum((uint8_t *)e_00[-4].prev[1].next,(ulong)*(ushort *)&e_00[-4].prev[2].prev
                           ,0,CRC32);
      uVar10 = (ulong)uVar9 % (*ppwVar11)->num_shards;
      lVar6 = uVar10 * 3;
      pthread_spin_lock(&(*ppwVar11)->key_shards[uVar10].lock);
      local_48 = lVar6;
      plVar3 = local_38;
      if (((ulong)e_00[-2].prev & 0x100) == 0) {
        if (((ulong)e_00[-2].prev & 0x400) == 0) {
          kv_id = 0;
        }
        else {
          buf2kvid((ulong)*(byte *)((long)&e_00[-4].prev[2].prev + 2),e_00[-4].prev[1].next,&kv_id);
        }
        fVar7 = kv_id;
        LOCK();
        pbVar1 = (byte *)((long)&e_00[-2].prev + 1);
        *pbVar1 = *pbVar1 | 1;
        UNLOCK();
        if (e_00[-4].next != local_58) {
          LOCK();
          ((*ppwVar11)->num_flushable).super___atomic_base<unsigned_int>._M_i =
               ((*ppwVar11)->num_flushable).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
          if (*(char *)&e_00[-2].prev != '\0') {
            _kvs_stat_update_attr(file,kv_id,KVS_STAT_WAL_NDELETES,1);
          }
          _kvs_stat_update_attr(file,fVar7,KVS_STAT_WAL_NDOCS,1);
        }
        if ((local_50 != (wal_commit_mark_func *)0x0) &&
           (status = (*local_50)(local_68->handle,(uint64_t)e_00[-2].next),
           status != FDB_RESULT_SUCCESS)) {
          fdb_log_impl(local_60,2,status,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                       ,"wal_commit",0x511,
                       "Error in appending a commit mark at offset %lu in a database file \'%s\'",
                       e_00[-2].next,file->filename);
          pthread_spin_unlock(&file->wal->key_shards[uVar10].lock);
          goto LAB_0010e376;
        }
        list_remove((list *)&e_00[-4].prev[2].next,(list_elem *)&e_00[-7].next);
        list_push_back((list *)&e_00[-4].prev[2].next,(list_elem *)&e_00[-7].next);
        e = e_00[-7].next;
        plVar8 = e_00;
        plVar3 = local_38;
        while ((local_38 = plVar8, e != (list_elem *)0x0 &&
               (plVar3 = local_38, ((ulong)e[4].next & 0x100) != 0))) {
          plVar3 = e->prev;
          if (((ulong)e[4].next & 0x200) == 0) {
            list_remove((list *)&e_00[-4].prev[2].next,e);
            if (file->config->seqtree_opt == '\x01') {
              uVar10 = (ulong)e[5].next % (*ppwVar11)->num_shards;
              pthread_spin_lock(&(*ppwVar11)->seq_shards[uVar10].lock);
              avl_remove(&(*ppwVar11)->seq_shards[uVar10]._map,(avl_node *)(e + 1));
              pthread_spin_unlock(&(*ppwVar11)->seq_shards[uVar10].lock);
            }
            if (*(byte *)&e[4].next < 2) {
              filemgr_mark_stale(file,(bid_t)e[5].prev,(ulong)*(uint *)((long)&e[4].next + 4));
            }
            fVar7 = kv_id;
            LOCK();
            ((*ppwVar11)->size).super___atomic_base<unsigned_int>._M_i =
                 ((*ppwVar11)->size).super___atomic_base<unsigned_int>._M_i - 1;
            UNLOCK();
            LOCK();
            ((*ppwVar11)->num_flushable).super___atomic_base<unsigned_int>._M_i =
                 ((*ppwVar11)->num_flushable).super___atomic_base<unsigned_int>._M_i - 1;
            UNLOCK();
            if (*(char *)&e_00[-2].prev != '\x02') {
              LOCK();
              ((*ppwVar11)->datasize).super___atomic_base<unsigned_long>._M_i =
                   ((*ppwVar11)->datasize).super___atomic_base<unsigned_long>._M_i -
                   (ulong)*(uint *)((long)&e[4].next + 4);
              UNLOCK();
            }
            if (*(char *)&e[4].next != '\0') {
              _kvs_stat_update_attr(file,kv_id,KVS_STAT_WAL_NDELETES,-1);
            }
            _kvs_stat_update_attr(file,fVar7,KVS_STAT_WAL_NDOCS,-1);
            pwVar4 = file->wal;
            node = (avl_node *)e[4].prev;
            LOCK();
            ppaVar2 = &node[2].left;
            *ppaVar2 = (avl_node *)((long)&(*ppaVar2)[-1].right + 7);
            UNLOCK();
            if (*ppaVar2 == (avl_node *)0x0) {
              __lock = &pwVar4->lock;
              pthread_spin_lock(__lock);
              avl_remove(&pwVar4->wal_snapshot_tree,node);
              __ptr = node[3].right;
              while (__ptr != (avl_node *)0x0) {
                paVar5 = __ptr->left;
                free(__ptr);
                __ptr = paVar5;
              }
              free(node);
              pthread_spin_unlock(__lock);
            }
            local_78 = local_78 + 0x80;
            e[7].prev = (list_elem *)0x0;
            e[7].next = (list_elem *)0x0;
            e[6].prev = (list_elem *)0x0;
            e[6].next = (list_elem *)0x0;
            e[5].prev = (list_elem *)0x0;
            e[5].next = (list_elem *)0x0;
            e[4].prev = (list_elem *)0x0;
            e[4].next = (list_elem *)0x0;
            e[3].prev = (list_elem *)0x0;
            e[3].next = (list_elem *)0x0;
            e[2].prev = (list_elem *)0x0;
            e[2].next = (list_elem *)0x0;
            e[1].prev = (list_elem *)0x0;
            e[1].next = (list_elem *)0x0;
            e->prev = (list_elem *)0x0;
            e->next = (list_elem *)0x0;
            free(e);
            e = plVar3;
            ppwVar11 = local_40;
            e_00 = local_38;
            plVar8 = local_38;
            plVar3 = local_38;
          }
          else {
            fdb_log_impl(local_60,5,FDB_RESULT_SUCCESS,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                         ,"wal_commit",0x557,
                         "Wal commit called when wal_flush in progress.item seqnum %lu keylen %d flags %x action %d%s"
                         ,e[5].next,(ulong)*(ushort *)&e_00[-4].prev[2].prev,
                         (ulong)*(byte *)((long)&e[4].next + 1),(ulong)*(byte *)&e[4].next,
                         file->filename);
            e = plVar3;
            plVar8 = local_38;
            plVar3 = local_38;
          }
        }
      }
      local_38 = plVar3;
      txn = local_68;
      e_00 = list_remove(local_68->items,e_00);
      pthread_spin_unlock(&(*ppwVar11)->key_shards->lock + local_48 * 2);
    } while (e_00 != (list_elem *)0x0);
  }
  ppwVar11 = &file->wal;
  status = FDB_RESULT_SUCCESS;
LAB_0010e376:
  LOCK();
  ((*ppwVar11)->mem_overhead).super___atomic_base<unsigned_long>._M_i =
       ((*ppwVar11)->mem_overhead).super___atomic_base<unsigned_long>._M_i - local_78;
  UNLOCK();
  return status;
}

Assistant:

fdb_status wal_commit(fdb_txn *txn, struct filemgr *file,
                      wal_commit_mark_func *func,
                      err_log_callback *log_callback)
{
    int can_overwrite;
    struct wal_item *item, *_item;
    struct list_elem *e1, *e2;
    fdb_kvs_id_t kv_id;
    fdb_status status = FDB_RESULT_SUCCESS;
    size_t shard_num;
    uint64_t mem_overhead = 0;

    e1 = list_begin(txn->items);
    while(e1) {
        item = _get_entry(e1, struct wal_item, list_elem_txn);
        fdb_assert(item->txn_id == txn->txn_id, item->txn_id, txn->txn_id);
        // Grab the WAL key shard lock.
        shard_num = get_checksum((uint8_t*)item->header->key,
                                 item->header->keylen) %
                                 file->wal->num_shards;
        spin_lock(&file->wal->key_shards[shard_num].lock);

        if (!(item->flag & WAL_ITEM_COMMITTED)) {
            // get KVS ID
            if (item->flag & WAL_ITEM_MULTI_KV_INS_MODE) {
                buf2kvid(item->header->chunksize, item->header->key, &kv_id);
            } else {
                kv_id = 0;
            }

            item->flag |= WAL_ITEM_COMMITTED;
            if (item->txn != &file->global_txn) {
                // increase num_flushable if it is transactional update
                atomic_incr_uint32_t(&file->wal->num_flushable);
                // Also since a transaction doc was committed
                // update global WAL stats to reflect this change..
                if (item->action == WAL_ACT_INSERT) {
                    _wal_update_stat(file, kv_id, _WAL_NEW_SET);
                } else {
                    _wal_update_stat(file, kv_id, _WAL_NEW_DEL);
                }
            }
            // append commit mark if necessary
            if (func) {
                status = func(txn->handle, item->offset);
                if (status != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            "Error in appending a commit mark at offset %"
                            _F64 " in "
                            "a database file '%s'", item->offset,
                            file->filename);
                    spin_unlock(&file->wal->key_shards[shard_num].lock);
                    atomic_sub_uint64_t(&file->wal->mem_overhead, mem_overhead,
                                        std::memory_order_relaxed);
                    return status;
                }
            }
            // remove previously committed item if no snapshots refer to it,
            // move the committed item to the end of the wal_item_header's list
            list_remove(&item->header->items, &item->list_elem);
            list_push_back(&item->header->items, &item->list_elem);
            // now reverse scan among other committed items to de-duplicate..
            e2 = list_prev(&item->list_elem);
            while(e2) {
                _item = _get_entry(e2, struct wal_item, list_elem);
                if (!(_item->flag & WAL_ITEM_COMMITTED)) {
                    break;
                }
                e2 = list_prev(e2);
                can_overwrite = (item->shandle == _item->shandle ||
                                 _wal_can_discard(file->wal, _item, item));
                if (!can_overwrite) {
                    item = _item; // new covering item found
                    continue;
                }
                // committed but not flush-ready
                // (flush-readied item will be removed by flushing)
                if (!(_item->flag & WAL_ITEM_FLUSH_READY)) {
                    // remove from list & hash
                    list_remove(&item->header->items, &_item->list_elem);
                    if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
                        size_t seq_shard_num = _item->seqnum
                                             % file->wal->num_shards;
                        spin_lock(&file->wal->seq_shards[seq_shard_num].lock);
                        avl_remove(&file->wal->seq_shards[seq_shard_num]._map,
                                   &_item->avl_seq);
                        spin_unlock(&file->wal->seq_shards[seq_shard_num].lock);
                    }

                    // mark previous doc region as stale
                    uint32_t stale_len = _item->doc_size;
                    uint64_t stale_offset = _item->offset;
                    if (_item->action == WAL_ACT_INSERT ||
                        _item->action == WAL_ACT_LOGICAL_REMOVE) {
                        // insert or logical remove
                        filemgr_mark_stale(file, stale_offset, stale_len);
                    }

                    atomic_decr_uint32_t(&file->wal->size);
                    atomic_decr_uint32_t(&file->wal->num_flushable);
                    if (item->action != WAL_ACT_REMOVE) {
                        atomic_sub_uint64_t(&file->wal->datasize,
                                            _item->doc_size,
                                            std::memory_order_relaxed);
                    }
                    // simply reduce the stat count...
                    if (_item->action == WAL_ACT_INSERT) {
                        _wal_update_stat(file, kv_id, _WAL_DROP_SET);
                    } else {
                        _wal_update_stat(file, kv_id, _WAL_DROP_DELETE);
                    }
                    mem_overhead += sizeof(struct wal_item);
                    _wal_free_item(_item, file->wal);
                } else {
                    fdb_log(log_callback, FDB_LOG_DEBUG, status,
                            "Wal commit called when wal_flush in progress."
                            "item seqnum %" _F64
                            " keylen %d flags %x action %d"
                            "%s", _item->seqnum, item->header->keylen,
                            atomic_get_uint8_t(&_item->flag),
                            _item->action, file->filename);
                }
            }
        }

        // remove from transaction's list
        e1 = list_remove(txn->items, e1);
        spin_unlock(&file->wal->key_shards[shard_num].lock);
    }
    atomic_sub_uint64_t(&file->wal->mem_overhead, mem_overhead,
                        std::memory_order_relaxed);

    return status;
}